

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O0

void Gia_ManCollapseDeref(DdManager *dd,Vec_Ptr_t *vFuncs)

{
  int iVar1;
  DdNode *n;
  undefined4 local_24;
  int i;
  DdNode *bFunc;
  Vec_Ptr_t *vFuncs_local;
  DdManager *dd_local;
  
  for (local_24 = 0; iVar1 = Vec_PtrSize(vFuncs), local_24 < iVar1; local_24 = local_24 + 1) {
    n = (DdNode *)Vec_PtrEntry(vFuncs,local_24);
    if (n != (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,n);
    }
  }
  Vec_PtrFree(vFuncs);
  return;
}

Assistant:

void Gia_ManCollapseDeref( DdManager * dd, Vec_Ptr_t * vFuncs )
{
    DdNode * bFunc; int i;
    Vec_PtrForEachEntry( DdNode *, vFuncs, bFunc, i )
        if ( bFunc )
            Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vFuncs );
}